

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_suite.cpp
# Opt level: O2

void __thiscall reader_path_suite::test_empty::test_method(test_empty *this)

{
  bool bVar1;
  view_type *view;
  char input [1];
  uint local_16c;
  view_type local_168;
  undefined8 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  string_type local_138;
  char *local_118;
  char *local_110;
  path reader;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_168.ptr_ = input;
  input[0] = '\0';
  local_168.len_ = strlen(local_168.ptr_);
  trial::url::reader::basic_path<char>::basic_path(&reader,&local_168);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/path_suite.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x17);
  local_168.len_ = local_168.len_ & 0xffffffffffffff00;
  local_168.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_158 = &boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/path_suite.cpp"
  ;
  local_58 = "";
  local_138._M_dataplus._M_p._0_4_ =
       trial::url::token::code
                 (reader.super_base<char,_trial::url::reader::basic_path>.current_token);
  local_16c = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::code::value,trial::url::token::code::value>
            (&local_168,&local_60,0x17,2,2,&local_138,"reader.code()",&local_16c,
             "url::token::code::end");
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/path_suite.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x18);
  local_168.len_ = local_168.len_ & 0xffffffffffffff00;
  local_168.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_158 = &boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/path_suite.cpp"
  ;
  local_88 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[1]>
            (&local_168,&local_90,0x18,2,2,
             &reader.super_base<char,_trial::url::reader::basic_path>.current_view,
             "reader.literal()","","\"\"");
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/path_suite.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x19);
  local_168.len_ = local_168.len_ & 0xffffffffffffff00;
  local_168.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_158 = &boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/path_suite.cpp"
  ;
  local_110 = "";
  trial::url::syntax::segment<char>::decode_abi_cxx11_
            (&local_138,
             (segment<char> *)&reader.super_base<char,_trial::url::reader::basic_path>.current_view,
             view);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (&local_168,&local_118,0x19,2,2,&local_138,"reader.value<std::string>()","","\"\"");
  std::__cxx11::string::~string((string *)&local_138);
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/path_suite.cpp"
  ;
  local_b8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x1a);
  local_168.len_ = local_168.len_ & 0xffffffffffffff00;
  local_168.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_158 = &boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/path_suite.cpp"
  ;
  local_140 = "";
  bVar1 = trial::url::reader::basic_path<char>::do_next(&reader);
  local_138._M_dataplus._M_p._0_4_ = CONCAT31(local_138._M_dataplus._M_p._1_3_,bVar1);
  local_16c = local_16c & 0xffffff00;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_168,&local_148,0x1a,2,2,&local_138,"reader.next()",&local_16c,"false");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_empty)
{
    const char input[] = "";
    url::reader::path reader(input);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::end);
    BOOST_REQUIRE_EQUAL(reader.literal(), "");
    BOOST_REQUIRE_EQUAL(reader.value<std::string>(), "");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}